

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::StructMatchEquality<false,duckdb::NotDistinctFrom>
                (Vector *lhs_vector,TupleDataVectorFormat *lhs_format,SelectionVector *sel,
                idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *child_functions,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  ValidityMask *this;
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  value_type vVar4;
  bool bVar5;
  const_reference pvVar6;
  TupleDataLayout *pTVar7;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type pVVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  ulong uVar11;
  idx_t i;
  idx_t iVar12;
  idx_t row_idx;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t struct_col_idx;
  LogicalType local_b0;
  Vector rhs_struct_row_locations;
  
  pSVar1 = (lhs_format->unified).sel;
  this = &(lhs_format->unified).validity;
  pdVar2 = rhs_row_locations->data;
  iVar14 = 0;
  for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
    iVar15 = iVar12;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar15 = (idx_t)sel->sel_vector[iVar12];
    }
    psVar3 = pSVar1->sel_vector;
    row_idx = iVar15;
    if (psVar3 != (sel_t *)0x0) {
      row_idx = (idx_t)psVar3[iVar15];
    }
    if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&this->super_TemplatedValidityMask<unsigned_long>,row_idx);
      bVar5 = !bVar5;
    }
    rhs_struct_row_locations._0_8_ = *(undefined8 *)(pdVar2 + iVar15 * 8);
    rhs_struct_row_locations.type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (((long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(rhs_layout->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18);
    rhs_struct_row_locations.type.id_ = INVALID;
    rhs_struct_row_locations.type.physical_type_ = ~INVALID;
    rhs_struct_row_locations.type._2_6_ = 0;
    rhs_struct_row_locations.type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (bVar5 != ((1 << ((byte)col_idx & 7) &
                  (uint)*(byte *)(rhs_struct_row_locations._0_8_ + (col_idx >> 3))) != 0)) {
      sel->sel_vector[iVar14] = (sel_t)iVar15;
      iVar14 = iVar14 + 1;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &rhs_struct_row_locations.type.type_info_);
  }
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&rhs_struct_row_locations,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  pvVar6 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  vVar4 = *pvVar6;
  for (uVar11 = 0; iVar14 != uVar11; uVar11 = uVar11 + 1) {
    uVar13 = uVar11;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar13 = (ulong)sel->sel_vector[uVar11];
    }
    *(value_type *)(rhs_struct_row_locations.data + uVar13 * 8) =
         *(long *)(pdVar2 + uVar13 * 8) + vVar4;
  }
  pTVar7 = TupleDataLayout::GetStructLayout(rhs_layout,col_idx);
  this_00 = StructVector::GetEntries(lhs_vector);
  for (uVar11 = 0;
      uVar11 < (ulong)(((long)(pTVar7->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar7->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar11 = uVar11 + 1
      ) {
    this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_00,uVar11);
    pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_01);
    pvVar9 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(&lhs_format->children,uVar11);
    pvVar10 = vector<duckdb::MatchFunction,_true>::get<true>(child_functions,uVar11);
    iVar14 = (*pvVar10->function)
                       (pVVar8,pvVar9,sel,iVar14,pTVar7,&rhs_struct_row_locations,uVar11,
                        &pvVar10->child_functions,no_match_sel,no_match_count);
  }
  Vector::~Vector(&rhs_struct_row_locations);
  return iVar14;
}

Assistant:

static idx_t StructMatchEquality(Vector &lhs_vector, const TupleDataVectorFormat &lhs_format, SelectionVector &sel,
                                 const idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                                 const idx_t col_idx, const vector<MatchFunction> &child_functions,
                                 SelectionVector *no_match_sel, idx_t &no_match_count) {
	using COMPARISON_OP = ComparisonOperationWrapper<OP>;

	// LHS
	const auto &lhs_sel = *lhs_format.unified.sel;
	const auto &lhs_validity = lhs_format.unified.validity;

	// RHS
	const auto rhs_locations = FlatVector::GetData<data_ptr_t>(rhs_row_locations);
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	idx_t match_count = 0;
	for (idx_t i = 0; i < count; i++) {
		const auto idx = sel.get_index(i);

		const auto lhs_idx = lhs_sel.get_index(idx);
		const auto lhs_null = lhs_validity.AllValid() ? false : !lhs_validity.RowIsValid(lhs_idx);

		const auto &rhs_location = rhs_locations[idx];
		const ValidityBytes rhs_mask(rhs_location, rhs_layout.ColumnCount());
		const auto rhs_null = !rhs_mask.RowIsValid(rhs_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry);

		// For structs there is no value to compare, here we match NULLs and let recursion do the rest
		// So we use the comparison only if rhs or LHS is NULL and COMPARE_NULL is true
		if (!(lhs_null || rhs_null) ||
		    (COMPARISON_OP::COMPARE_NULL && COMPARISON_OP::template Operation<uint32_t>(0, 0, lhs_null, rhs_null))) {
			sel.set_index(match_count++, idx);
		} else if (NO_MATCH_SEL) {
			no_match_sel->set_index(no_match_count++, idx);
		}
	}

	// Create a Vector of pointers to the start of the TupleDataLayout of the STRUCT
	Vector rhs_struct_row_locations(LogicalType::POINTER);
	const auto rhs_offset_in_row = rhs_layout.GetOffsets()[col_idx];
	auto rhs_struct_locations = FlatVector::GetData<data_ptr_t>(rhs_struct_row_locations);
	for (idx_t i = 0; i < match_count; i++) {
		const auto idx = sel.get_index(i);
		rhs_struct_locations[idx] = rhs_locations[idx] + rhs_offset_in_row;
	}

	// Get the struct layout and struct entries
	const auto &rhs_struct_layout = rhs_layout.GetStructLayout(col_idx);
	auto &lhs_struct_vectors = StructVector::GetEntries(lhs_vector);
	D_ASSERT(rhs_struct_layout.ColumnCount() == lhs_struct_vectors.size());

	for (idx_t struct_col_idx = 0; struct_col_idx < rhs_struct_layout.ColumnCount(); struct_col_idx++) {
		auto &lhs_struct_vector = *lhs_struct_vectors[struct_col_idx];
		auto &lhs_struct_format = lhs_format.children[struct_col_idx];
		const auto &child_function = child_functions[struct_col_idx];
		match_count = child_function.function(lhs_struct_vector, lhs_struct_format, sel, match_count, rhs_struct_layout,
		                                      rhs_struct_row_locations, struct_col_idx, child_function.child_functions,
		                                      no_match_sel, no_match_count);
	}

	return match_count;
}